

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_image *
rf_gen_image_cellular_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,int tile_size,rf_rand_proc rand,
          rf_color *dst,rf_int dst_size)

{
  rf_vec2 rVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  uchar uVar11;
  int iVar12;
  long lVar13;
  int seeds_per_row;
  long lVar14;
  rf_int j;
  int iVar15;
  int i;
  float __x;
  
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  seeds_per_row = width / tile_size;
  if (width * height * 4 <= dst_size) {
    lVar13 = (long)width;
    lVar4 = 0;
    if (0 < lVar13) {
      lVar4 = lVar13;
    }
    uVar5 = 0;
    if (0 < height) {
      uVar5 = (ulong)(uint)height;
    }
    for (uVar10 = 0; uVar10 != uVar5; uVar10 = uVar10 + 1) {
      iVar3 = (int)((long)uVar10 / (long)tile_size);
      lVar6 = uVar10 * lVar13;
      for (lVar9 = 0; lVar9 != lVar4; lVar9 = lVar9 + 1) {
        iVar12 = (int)(lVar9 / (long)tile_size);
        iVar15 = (iVar3 + -1) * seeds_per_row + -1 + iVar12;
        __x = INFINITY;
        for (lVar14 = -1; lVar14 != 2; lVar14 = lVar14 + 1) {
          lVar7 = lVar14 + iVar12;
          if (lVar7 < seeds_per_row && -1 < lVar7) {
            i = iVar15;
            for (lVar7 = -1; lVar7 != 2; lVar7 = lVar7 + 1) {
              lVar8 = iVar3 + lVar7;
              if ((-1 < lVar8) && (lVar8 < height / tile_size)) {
                rVar1 = rf_get_seed_for_cellular_image(seeds_per_row,tile_size,i,rand);
                dVar2 = hypot((double)(lVar9 - (int)rVar1.x),
                              (double)(long)(uVar10 - (long)(int)rVar1.y));
                __x = fminf(__x,(float)dVar2);
              }
              i = i + seeds_per_row;
            }
          }
          iVar15 = iVar15 + 1;
        }
        iVar12 = (int)((__x * 256.0) / (float)tile_size);
        if (0xfe < iVar12) {
          iVar12 = 0xff;
        }
        uVar11 = (uchar)iVar12;
        dst[lVar6 + lVar9].r = uVar11;
        dst[lVar6 + lVar9].g = uVar11;
        dst[lVar6 + lVar9].b = uVar11;
        dst[lVar6 + lVar9].a = 0xff;
      }
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_cellular_to_buffer(int width, int height, int tile_size, rf_rand_proc rand, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    int seeds_per_row = width / tile_size;
    int seeds_per_col = height / tile_size;
    int seeds_count = seeds_per_row * seeds_per_col;

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        for (rf_int y = 0; y < height; y++)
        {
            int tile_y = y / tile_size;

            for (rf_int x = 0; x < width; x++)
            {
                int tile_x = x / tile_size;

                float min_distance = INFINITY;

                // Check all adjacent tiles
                for (rf_int i = -1; i < 2; i++)
                {
                    if ((tile_x + i < 0) || (tile_x + i >= seeds_per_row)) continue;

                    for (rf_int j = -1; j < 2; j++)
                    {
                        if ((tile_y + j < 0) || (tile_y + j >= seeds_per_col)) continue;

                        rf_vec2 neighbor_seed = rf_get_seed_for_cellular_image(seeds_per_row, tile_size, (tile_y + j) * seeds_per_row + tile_x + i, rand);

                        float dist = (float)hypot(x - (int)neighbor_seed.x, y - (int)neighbor_seed.y);
                        min_distance = (float)fmin(min_distance, dist);
                    }
                }

                // I made this up but it seems to give good results at all tile sizes
                int intensity = (int)(min_distance * 256.0f / tile_size);
                if (intensity > 255) intensity = 255;

                dst[y * width + x] = (rf_color) { intensity, intensity, intensity, 255 };
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true,
        };
    }

    return result;
}